

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::BVHNIntersector1<8,_16781328,_true,_embree::avx512::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  bool bVar3;
  float fVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [12];
  undefined1 auVar14 [32];
  AABBNodeMB4D *node1;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong unaff_R15;
  byte bVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  float fVar59;
  undefined4 uVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  vfloat4 a0;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  float local_2578 [4];
  undefined1 local_2568 [16];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  undefined1 local_2538 [8];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  float fStack_2520;
  undefined4 uStack_251c;
  undefined1 local_2518 [32];
  float local_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  float fStack_24e0;
  float fStack_24dc;
  undefined1 local_24d8 [32];
  undefined1 local_24b8 [32];
  undefined1 local_2498 [32];
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370;
  ulong local_2368 [1127];
  int iVar24;
  undefined1 auVar28 [16];
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar27 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar13 = ZEXT812(0) << 0x20;
    auVar30 = ZEXT816(0) << 0x40;
    auVar28._4_12_ = auVar13;
    auVar28._0_4_ = auVar27._0_4_;
    auVar25 = vrsqrt14ss_avx512f(auVar30,auVar28);
    fVar59 = auVar25._0_4_;
    local_2578[0] = fVar59 * 1.5 - auVar27._0_4_ * 0.5 * fVar59 * fVar59 * fVar59;
    local_24f8 = aVar2.x;
    auVar63._0_4_ = local_24f8 * local_2578[0];
    auVar63._4_4_ = aVar2.y * local_2578[0];
    auVar63._8_4_ = aVar2.z * local_2578[0];
    auVar63._12_4_ = aVar2.field_3.w * local_2578[0];
    auVar25 = vshufpd_avx(auVar63,auVar63,1);
    auVar27 = vmovshdup_avx(auVar63);
    auVar70._8_4_ = 0x80000000;
    auVar70._0_8_ = 0x8000000080000000;
    auVar70._12_4_ = 0x80000000;
    auVar67._0_4_ = auVar27._0_4_ ^ 0x80000000;
    auVar27 = vunpckhps_avx(auVar63,auVar30);
    auVar67._4_12_ = auVar13;
    auVar28 = vshufps_avx(auVar27,auVar67,0x41);
    auVar64._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
    auVar64._8_8_ = auVar70._8_8_ ^ auVar25._8_8_;
    auVar26 = vinsertps_avx(auVar64,auVar63,0x2a);
    auVar27 = vdpps_avx(auVar28,auVar28,0x7f);
    auVar25 = vdpps_avx(auVar26,auVar26,0x7f);
    uVar5 = vcmpps_avx512vl(auVar25,auVar27,1);
    auVar27 = vpmovm2d_avx512vl(uVar5);
    auVar71._0_4_ = auVar27._0_4_;
    auVar71._4_4_ = auVar71._0_4_;
    auVar71._8_4_ = auVar71._0_4_;
    auVar71._12_4_ = auVar71._0_4_;
    uVar22 = vpmovd2m_avx512vl(auVar71);
    auVar27 = vpcmpeqd_avx(auVar71,auVar71);
    auVar25._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar27._4_4_;
    auVar25._0_4_ = (uint)((byte)uVar22 & 1) * auVar27._0_4_;
    auVar25._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar27._8_4_;
    auVar25._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar27._12_4_;
    auVar27 = vblendvps_avx(auVar26,auVar28,auVar25);
    auVar25 = vdpps_avx(auVar27,auVar27,0x7f);
    auVar72._4_12_ = auVar13;
    auVar72._0_4_ = auVar25._0_4_;
    auVar26 = vrsqrt14ss_avx512f(auVar30,auVar72);
    fVar59 = auVar26._0_4_;
    auVar75 = ZEXT464((uint)(fVar59 * fVar59));
    fVar59 = fVar59 * 1.5 - auVar25._0_4_ * 0.5 * fVar59 * fVar59 * fVar59;
    auVar65._0_4_ = fVar59 * auVar27._0_4_;
    auVar65._4_4_ = fVar59 * auVar27._4_4_;
    auVar65._8_4_ = fVar59 * auVar27._8_4_;
    auVar65._12_4_ = fVar59 * auVar27._12_4_;
    auVar27 = vshufps_avx(auVar65,auVar65,0xc9);
    auVar25 = vshufps_avx(auVar63,auVar63,0xc9);
    auVar73._0_4_ = auVar25._0_4_ * auVar65._0_4_;
    auVar73._4_4_ = auVar25._4_4_ * auVar65._4_4_;
    auVar73._8_4_ = auVar25._8_4_ * auVar65._8_4_;
    auVar73._12_4_ = auVar25._12_4_ * auVar65._12_4_;
    auVar27 = vfmsub231ps_fma(auVar73,auVar63,auVar27);
    auVar25 = vshufps_avx(auVar27,auVar27,0xc9);
    auVar27 = vdpps_avx(auVar25,auVar25,0x7f);
    auVar26._4_12_ = auVar13;
    auVar26._0_4_ = auVar27._0_4_;
    auVar26 = vrsqrt14ss_avx512f(auVar30,auVar26);
    fVar59 = auVar26._0_4_;
    fVar59 = fVar59 * 1.5 - auVar27._0_4_ * 0.5 * fVar59 * fVar59 * fVar59;
    auVar31._0_4_ = auVar25._0_4_ * fVar59;
    auVar31._4_4_ = auVar25._4_4_ * fVar59;
    auVar31._8_4_ = auVar25._8_4_ * fVar59;
    auVar31._12_4_ = auVar25._12_4_ * fVar59;
    auVar27._0_4_ = local_2578[0] * auVar63._0_4_;
    auVar27._4_4_ = local_2578[0] * auVar63._4_4_;
    auVar27._8_4_ = local_2578[0] * auVar63._8_4_;
    auVar27._12_4_ = local_2578[0] * auVar63._12_4_;
    auVar26 = vunpcklps_avx(auVar65,auVar27);
    auVar27 = vunpckhps_avx(auVar65,auVar27);
    auVar28 = vunpcklps_avx(auVar31,auVar30);
    auVar25 = vunpckhps_avx(auVar31,auVar30);
    local_2548 = vunpcklps_avx(auVar27,auVar25);
    local_2568 = vunpcklps_avx(auVar26,auVar28);
    local_2558 = vunpckhps_avx(auVar26,auVar28);
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370 = 0;
    if (local_2378 != 8) {
      auVar25 = vmaxss_avx(ZEXT816(0) << 0x20,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar26 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar30._8_4_ = 0x7fffffff;
      auVar30._0_8_ = 0x7fffffff7fffffff;
      auVar30._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx512vl((undefined1  [16])aVar2,auVar30);
      auVar9._8_4_ = 0x219392ef;
      auVar9._0_8_ = 0x219392ef219392ef;
      auVar9._12_4_ = 0x219392ef;
      uVar22 = vcmpps_avx512vl(auVar27,auVar9,1);
      auVar62._8_4_ = 0x3f800000;
      auVar62._0_8_ = &DAT_3f8000003f800000;
      auVar62._12_4_ = 0x3f800000;
      auVar27 = vdivps_avx(auVar62,(undefined1  [16])aVar2);
      auVar28 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar3 = (bool)((byte)uVar22 & 1);
      auVar29._0_4_ = (uint)bVar3 * auVar28._0_4_ | (uint)!bVar3 * auVar27._0_4_;
      bVar3 = (bool)((byte)(uVar22 >> 1) & 1);
      auVar29._4_4_ = (uint)bVar3 * auVar28._4_4_ | (uint)!bVar3 * auVar27._4_4_;
      bVar3 = (bool)((byte)(uVar22 >> 2) & 1);
      auVar29._8_4_ = (uint)bVar3 * auVar28._8_4_ | (uint)!bVar3 * auVar27._8_4_;
      bVar3 = (bool)((byte)(uVar22 >> 3) & 1);
      auVar29._12_4_ = (uint)bVar3 * auVar28._12_4_ | (uint)!bVar3 * auVar27._12_4_;
      auVar10._8_4_ = 0x3f7ffffa;
      auVar10._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar10._12_4_ = 0x3f7ffffa;
      auVar30 = vmulps_avx512vl(auVar29,auVar10);
      auVar11._8_4_ = 0x3f800003;
      auVar11._0_8_ = 0x3f8000033f800003;
      auVar11._12_4_ = 0x3f800003;
      auVar31 = vmulps_avx512vl(auVar29,auVar11);
      local_23b8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
      auVar79 = ZEXT3264(local_23b8);
      puVar18 = local_2368;
      local_23d8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
      auVar80 = ZEXT3264(local_23d8);
      local_23f8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
      auVar81 = ZEXT3264(local_23f8);
      auVar36._8_4_ = 1;
      auVar36._0_8_ = 0x100000001;
      auVar36._12_4_ = 1;
      auVar36._16_4_ = 1;
      auVar36._20_4_ = 1;
      auVar36._24_4_ = 1;
      auVar36._28_4_ = 1;
      local_2518 = vpermps_avx2(auVar36,ZEXT1632((undefined1  [16])aVar2));
      auVar35._8_4_ = 2;
      auVar35._0_8_ = 0x200000002;
      auVar35._12_4_ = 2;
      auVar35._16_4_ = 2;
      auVar35._20_4_ = 2;
      auVar35._24_4_ = 2;
      auVar35._28_4_ = 2;
      _local_2538 = vpermps_avx2(auVar35,ZEXT1632((undefined1  [16])aVar2));
      local_2418 = vbroadcastss_avx512vl(auVar30);
      auVar82 = ZEXT3264(local_2418);
      auVar27 = vmovshdup_avx(auVar30);
      local_2438 = vbroadcastsd_avx512vl(auVar27);
      auVar83 = ZEXT3264(local_2438);
      auVar28 = vshufpd_avx(auVar30,auVar30,1);
      local_2458 = vpermps_avx512vl(auVar35,ZEXT1632(auVar30));
      auVar84 = ZEXT3264(local_2458);
      local_2478 = vbroadcastss_avx512vl(auVar31);
      auVar85 = ZEXT3264(local_2478);
      local_2498 = vpermps_avx512vl(auVar36,ZEXT1632(auVar31));
      auVar86 = ZEXT3264(local_2498);
      local_24b8 = vpermps_avx512vl(auVar35,ZEXT1632(auVar31));
      auVar87 = ZEXT3264(local_24b8);
      uVar22 = (ulong)(auVar30._0_4_ < 0.0) * 0x20;
      uVar19 = (ulong)(auVar27._0_4_ < 0.0) << 5 | 0x40;
      uVar20 = (ulong)(auVar28._0_4_ < 0.0) << 5 | 0x80;
      local_24d8 = vbroadcastss_avx512vl(auVar25);
      auVar88 = ZEXT3264(local_24d8);
      uVar60 = auVar26._0_4_;
      auVar57 = ZEXT3264(CONCAT428(uVar60,CONCAT424(uVar60,CONCAT420(uVar60,CONCAT416(uVar60,
                                                  CONCAT412(uVar60,CONCAT48(uVar60,CONCAT44(uVar60,
                                                  uVar60))))))));
      auVar35 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar69 = ZEXT3264(auVar35);
      auVar74 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      fStack_24f4 = local_24f8;
      fStack_24f0 = local_24f8;
      fStack_24ec = local_24f8;
      fStack_24e8 = local_24f8;
      fStack_24e4 = local_24f8;
      fStack_24e0 = local_24f8;
      fStack_24dc = local_24f8;
      do {
        do {
          if (puVar18 == &local_2378) {
            return;
          }
          pfVar1 = (float *)(puVar18 + -1);
          puVar18 = puVar18 + -2;
        } while ((ray->super_RayK<1>).tfar < *pfVar1);
        uVar23 = *puVar18;
        do {
          if ((uVar23 & 8) == 0) {
            fVar59 = (ray->super_RayK<1>).dir.field_0.m128[3];
            uVar17 = (uint)uVar23 & 7;
            uVar15 = uVar23 & 0xfffffffffffffff0;
            auVar35 = auVar79._0_32_;
            auVar36 = auVar80._0_32_;
            auVar37 = auVar81._0_32_;
            if (uVar17 == 3) {
              auVar32 = *(undefined1 (*) [32])(uVar15 + 0x100);
              auVar33 = *(undefined1 (*) [32])(uVar15 + 0x120);
              auVar34 = *(undefined1 (*) [32])(uVar15 + 0x140);
              auVar76._4_4_ = fVar59;
              auVar76._0_4_ = fVar59;
              auVar76._8_4_ = fVar59;
              auVar76._12_4_ = fVar59;
              auVar76._16_4_ = fVar59;
              auVar76._20_4_ = fVar59;
              auVar76._24_4_ = fVar59;
              auVar76._28_4_ = fVar59;
              fVar4 = 1.0 - fVar59;
              auVar69._0_4_ = fVar59 * *(float *)(uVar15 + 0x1c0);
              auVar69._4_4_ = fVar59 * *(float *)(uVar15 + 0x1c4);
              auVar69._8_4_ = fVar59 * *(float *)(uVar15 + 0x1c8);
              auVar69._12_4_ = fVar59 * *(float *)(uVar15 + 0x1cc);
              auVar69._16_4_ = fVar59 * *(float *)(uVar15 + 0x1d0);
              auVar69._20_4_ = fVar59 * *(float *)(uVar15 + 0x1d4);
              auVar69._28_36_ = auVar75._28_36_;
              auVar69._24_4_ = fVar59 * *(float *)(uVar15 + 0x1d8);
              auVar77._4_4_ = fVar4;
              auVar77._0_4_ = fVar4;
              auVar77._8_4_ = fVar4;
              auVar77._12_4_ = fVar4;
              auVar77._16_4_ = fVar4;
              auVar77._20_4_ = fVar4;
              auVar77._24_4_ = fVar4;
              auVar77._28_4_ = fVar4;
              auVar68._0_4_ = fVar59 * *(float *)(uVar15 + 0x1e0);
              auVar68._4_4_ = fVar59 * *(float *)(uVar15 + 0x1e4);
              auVar68._8_4_ = fVar59 * *(float *)(uVar15 + 0x1e8);
              auVar68._12_4_ = fVar59 * *(float *)(uVar15 + 0x1ec);
              auVar68._16_4_ = fVar59 * *(float *)(uVar15 + 0x1f0);
              auVar68._20_4_ = fVar59 * *(float *)(uVar15 + 500);
              auVar68._24_4_ = fVar59 * *(float *)(uVar15 + 0x1f8);
              auVar68._28_4_ = 0;
              auVar66._0_4_ = fVar59 * *(float *)(uVar15 + 0x200);
              auVar66._4_4_ = fVar59 * *(float *)(uVar15 + 0x204);
              auVar66._8_4_ = fVar59 * *(float *)(uVar15 + 0x208);
              auVar66._12_4_ = fVar59 * *(float *)(uVar15 + 0x20c);
              auVar66._16_4_ = fVar59 * *(float *)(uVar15 + 0x210);
              auVar66._20_4_ = fVar59 * *(float *)(uVar15 + 0x214);
              auVar66._24_4_ = fVar59 * *(float *)(uVar15 + 0x218);
              auVar66._28_4_ = 0;
              auVar26 = ZEXT816(0) << 0x40;
              auVar27 = vfmadd231ps_fma(auVar69._0_32_,auVar77,ZEXT1632(auVar26));
              auVar25 = vfmadd231ps_fma(auVar68,auVar77,ZEXT1632(auVar26));
              auVar26 = vfmadd231ps_fma(auVar66,auVar77,ZEXT1632(auVar26));
              auVar78._0_4_ = fVar59 * *(float *)(uVar15 + 0x220);
              auVar78._4_4_ = fVar59 * *(float *)(uVar15 + 0x224);
              auVar78._8_4_ = fVar59 * *(float *)(uVar15 + 0x228);
              auVar78._12_4_ = fVar59 * *(float *)(uVar15 + 0x22c);
              auVar78._16_4_ = fVar59 * *(float *)(uVar15 + 0x230);
              auVar78._20_4_ = fVar59 * *(float *)(uVar15 + 0x234);
              auVar78._24_4_ = fVar59 * *(float *)(uVar15 + 0x238);
              auVar78._28_4_ = 0;
              auVar38 = vmulps_avx512vl(auVar76,*(undefined1 (*) [32])(uVar15 + 0x240));
              auVar41._4_4_ = fVar59 * *(float *)(uVar15 + 0x264);
              auVar41._0_4_ = fVar59 * *(float *)(uVar15 + 0x260);
              auVar41._8_4_ = fVar59 * *(float *)(uVar15 + 0x268);
              auVar41._12_4_ = fVar59 * *(float *)(uVar15 + 0x26c);
              auVar41._16_4_ = fVar59 * *(float *)(uVar15 + 0x270);
              auVar41._20_4_ = fVar59 * *(float *)(uVar15 + 0x274);
              auVar41._24_4_ = fVar59 * *(float *)(uVar15 + 0x278);
              auVar41._28_4_ = fVar59;
              auVar39 = vaddps_avx512vl(auVar77,auVar78);
              auVar40 = vaddps_avx512vl(auVar77,auVar38);
              auVar41 = vaddps_avx512vl(auVar77,auVar41);
              auVar38._4_4_ = (float)local_2538._4_4_ * auVar32._4_4_;
              auVar38._0_4_ = (float)local_2538._0_4_ * auVar32._0_4_;
              auVar38._8_4_ = fStack_2530 * auVar32._8_4_;
              auVar38._12_4_ = fStack_252c * auVar32._12_4_;
              auVar38._16_4_ = fStack_2528 * auVar32._16_4_;
              auVar38._20_4_ = fStack_2524 * auVar32._20_4_;
              auVar38._24_4_ = fStack_2520 * auVar32._24_4_;
              auVar38._28_4_ = 0;
              auVar48._4_4_ = (float)local_2538._4_4_ * auVar33._4_4_;
              auVar48._0_4_ = (float)local_2538._0_4_ * auVar33._0_4_;
              auVar48._8_4_ = fStack_2530 * auVar33._8_4_;
              auVar48._12_4_ = fStack_252c * auVar33._12_4_;
              auVar48._16_4_ = fStack_2528 * auVar33._16_4_;
              auVar48._20_4_ = fStack_2524 * auVar33._20_4_;
              auVar48._24_4_ = fStack_2520 * auVar33._24_4_;
              auVar48._28_4_ = fVar59;
              auVar42._4_4_ = (float)local_2538._4_4_ * auVar34._4_4_;
              auVar42._0_4_ = (float)local_2538._0_4_ * auVar34._0_4_;
              auVar42._8_4_ = fStack_2530 * auVar34._8_4_;
              auVar42._12_4_ = fStack_252c * auVar34._12_4_;
              auVar42._16_4_ = fStack_2528 * auVar34._16_4_;
              auVar42._20_4_ = fStack_2524 * auVar34._20_4_;
              auVar42._24_4_ = fStack_2520 * auVar34._24_4_;
              auVar42._28_4_ = uStack_251c;
              auVar38 = vfmadd231ps_avx512vl
                                  (auVar38,local_2518,*(undefined1 (*) [32])(uVar15 + 0xa0));
              auVar48 = vfmadd231ps_avx512vl
                                  (auVar48,local_2518,*(undefined1 (*) [32])(uVar15 + 0xc0));
              auVar42 = vfmadd231ps_avx512vl
                                  (auVar42,local_2518,*(undefined1 (*) [32])(uVar15 + 0xe0));
              auVar14._4_4_ = fStack_24f4;
              auVar14._0_4_ = local_24f8;
              auVar14._8_4_ = fStack_24f0;
              auVar14._12_4_ = fStack_24ec;
              auVar14._16_4_ = fStack_24e8;
              auVar14._20_4_ = fStack_24e4;
              auVar14._24_4_ = fStack_24e0;
              auVar14._28_4_ = fStack_24dc;
              auVar38 = vfmadd231ps_avx512vl(auVar38,auVar14,*(undefined1 (*) [32])(uVar15 + 0x40));
              auVar48 = vfmadd231ps_avx512vl(auVar48,auVar14,*(undefined1 (*) [32])(uVar15 + 0x60));
              auVar42 = vfmadd231ps_avx512vl(auVar42,auVar14,*(undefined1 (*) [32])(uVar15 + 0x80));
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(auVar38,auVar43);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              uVar6 = vcmpps_avx512vl(auVar43,auVar44,1);
              bVar3 = (bool)((byte)uVar6 & 1);
              iVar24 = auVar44._0_4_;
              auVar45._0_4_ = (uint)bVar3 * iVar24 | (uint)!bVar3 * auVar38._0_4_;
              bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
              iVar50 = auVar44._4_4_;
              auVar45._4_4_ = (uint)bVar3 * iVar50 | (uint)!bVar3 * auVar38._4_4_;
              bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
              iVar51 = auVar44._8_4_;
              auVar45._8_4_ = (uint)bVar3 * iVar51 | (uint)!bVar3 * auVar38._8_4_;
              bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
              iVar52 = auVar44._12_4_;
              auVar45._12_4_ = (uint)bVar3 * iVar52 | (uint)!bVar3 * auVar38._12_4_;
              bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
              iVar53 = auVar44._16_4_;
              auVar45._16_4_ = (uint)bVar3 * iVar53 | (uint)!bVar3 * auVar38._16_4_;
              bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
              iVar54 = auVar44._20_4_;
              auVar45._20_4_ = (uint)bVar3 * iVar54 | (uint)!bVar3 * auVar38._20_4_;
              bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
              iVar55 = auVar44._24_4_;
              iVar56 = auVar44._28_4_;
              auVar45._24_4_ = (uint)bVar3 * iVar55 | (uint)!bVar3 * auVar38._24_4_;
              bVar3 = SUB81(uVar6 >> 7,0);
              auVar45._28_4_ = (uint)bVar3 * iVar56 | (uint)!bVar3 * auVar38._28_4_;
              vandps_avx512vl(auVar48,auVar43);
              uVar6 = vcmpps_avx512vl(auVar45,auVar44,1);
              bVar3 = (bool)((byte)uVar6 & 1);
              auVar46._0_4_ = (uint)bVar3 * iVar24 | (uint)!bVar3 * auVar48._0_4_;
              bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
              auVar46._4_4_ = (uint)bVar3 * iVar50 | (uint)!bVar3 * auVar48._4_4_;
              bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
              auVar46._8_4_ = (uint)bVar3 * iVar51 | (uint)!bVar3 * auVar48._8_4_;
              bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
              auVar46._12_4_ = (uint)bVar3 * iVar52 | (uint)!bVar3 * auVar48._12_4_;
              bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
              auVar46._16_4_ = (uint)bVar3 * iVar53 | (uint)!bVar3 * auVar48._16_4_;
              bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
              auVar46._20_4_ = (uint)bVar3 * iVar54 | (uint)!bVar3 * auVar48._20_4_;
              bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
              auVar46._24_4_ = (uint)bVar3 * iVar55 | (uint)!bVar3 * auVar48._24_4_;
              bVar3 = SUB81(uVar6 >> 7,0);
              auVar46._28_4_ = (uint)bVar3 * iVar56 | (uint)!bVar3 * auVar48._28_4_;
              vandps_avx512vl(auVar42,auVar43);
              uVar6 = vcmpps_avx512vl(auVar46,auVar44,1);
              bVar3 = (bool)((byte)uVar6 & 1);
              auVar47._0_4_ = (uint)bVar3 * iVar24 | (uint)!bVar3 * auVar42._0_4_;
              bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
              auVar47._4_4_ = (uint)bVar3 * iVar50 | (uint)!bVar3 * auVar42._4_4_;
              bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
              auVar47._8_4_ = (uint)bVar3 * iVar51 | (uint)!bVar3 * auVar42._8_4_;
              bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
              auVar47._12_4_ = (uint)bVar3 * iVar52 | (uint)!bVar3 * auVar42._12_4_;
              bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
              auVar47._16_4_ = (uint)bVar3 * iVar53 | (uint)!bVar3 * auVar42._16_4_;
              bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
              auVar47._20_4_ = (uint)bVar3 * iVar54 | (uint)!bVar3 * auVar42._20_4_;
              bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
              auVar47._24_4_ = (uint)bVar3 * iVar55 | (uint)!bVar3 * auVar42._24_4_;
              bVar3 = SUB81(uVar6 >> 7,0);
              auVar47._28_4_ = (uint)bVar3 * iVar56 | (uint)!bVar3 * auVar42._28_4_;
              auVar38 = vrcp14ps_avx512vl(auVar45);
              auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar42 = vfnmadd213ps_avx512vl(auVar45,auVar38,auVar48);
              auVar38 = vfmadd132ps_avx512vl(auVar42,auVar38,auVar38);
              auVar42 = vrcp14ps_avx512vl(auVar46);
              auVar43 = vfnmadd213ps_avx512vl(auVar46,auVar42,auVar48);
              auVar42 = vfmadd132ps_avx512vl(auVar43,auVar42,auVar42);
              auVar43 = vrcp14ps_avx512vl(auVar47);
              auVar48 = vfnmadd213ps_avx512vl(auVar47,auVar43,auVar48);
              auVar48 = vfmadd132ps_avx512vl(auVar48,auVar43,auVar43);
              auVar32 = vfmadd213ps_avx512vl(auVar32,auVar37,*(undefined1 (*) [32])(uVar15 + 0x160))
              ;
              auVar33 = vfmadd213ps_avx512vl(auVar33,auVar37,*(undefined1 (*) [32])(uVar15 + 0x180))
              ;
              auVar32 = vfmadd231ps_avx512vl(auVar32,auVar36,*(undefined1 (*) [32])(uVar15 + 0xa0));
              auVar33 = vfmadd231ps_avx512vl(auVar33,auVar36,*(undefined1 (*) [32])(uVar15 + 0xc0));
              auVar37 = vfmadd213ps_avx512vl(auVar34,auVar37,*(undefined1 (*) [32])(uVar15 + 0x1a0))
              ;
              auVar36 = vfmadd231ps_avx512vl(auVar37,auVar36,*(undefined1 (*) [32])(uVar15 + 0xe0));
              auVar74 = ZEXT3264(CONCAT428(0xfffffff8,
                                           CONCAT424(0xfffffff8,
                                                     CONCAT420(0xfffffff8,
                                                               CONCAT416(0xfffffff8,
                                                                         CONCAT412(0xfffffff8,
                                                                                   CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
              auVar37 = vfmadd231ps_avx512vl(auVar32,auVar35,*(undefined1 (*) [32])(uVar15 + 0x40));
              auVar32 = vfmadd231ps_avx512vl(auVar33,auVar35,*(undefined1 (*) [32])(uVar15 + 0x60));
              auVar33 = vfmadd231ps_avx512vl(auVar36,auVar35,*(undefined1 (*) [32])(uVar15 + 0x80));
              auVar35 = vsubps_avx(ZEXT1632(auVar27),auVar37);
              auVar43 = vsubps_avx512vl(auVar39,auVar37);
              auVar36 = vsubps_avx(ZEXT1632(auVar25),auVar32);
              auVar32 = vsubps_avx512vl(auVar40,auVar32);
              auVar37 = vsubps_avx(ZEXT1632(auVar26),auVar33);
              auVar33 = vsubps_avx512vl(auVar41,auVar33);
              auVar34._4_4_ = auVar38._4_4_ * auVar35._4_4_;
              auVar34._0_4_ = auVar38._0_4_ * auVar35._0_4_;
              auVar34._8_4_ = auVar38._8_4_ * auVar35._8_4_;
              auVar34._12_4_ = auVar38._12_4_ * auVar35._12_4_;
              auVar34._16_4_ = auVar38._16_4_ * auVar35._16_4_;
              auVar34._20_4_ = auVar38._20_4_ * auVar35._20_4_;
              auVar34._24_4_ = auVar38._24_4_ * auVar35._24_4_;
              auVar34._28_4_ = auVar35._28_4_;
              auVar39._4_4_ = auVar38._4_4_ * auVar43._4_4_;
              auVar39._0_4_ = auVar38._0_4_ * auVar43._0_4_;
              auVar39._8_4_ = auVar38._8_4_ * auVar43._8_4_;
              auVar39._12_4_ = auVar38._12_4_ * auVar43._12_4_;
              auVar39._16_4_ = auVar38._16_4_ * auVar43._16_4_;
              auVar39._20_4_ = auVar38._20_4_ * auVar43._20_4_;
              auVar39._24_4_ = auVar38._24_4_ * auVar43._24_4_;
              auVar39._28_4_ = auVar43._28_4_;
              auVar40._4_4_ = auVar42._4_4_ * auVar36._4_4_;
              auVar40._0_4_ = auVar42._0_4_ * auVar36._0_4_;
              auVar40._8_4_ = auVar42._8_4_ * auVar36._8_4_;
              auVar40._12_4_ = auVar42._12_4_ * auVar36._12_4_;
              auVar40._16_4_ = auVar42._16_4_ * auVar36._16_4_;
              auVar40._20_4_ = auVar42._20_4_ * auVar36._20_4_;
              auVar40._24_4_ = auVar42._24_4_ * auVar36._24_4_;
              auVar40._28_4_ = auVar36._28_4_;
              auVar43._4_4_ = auVar48._4_4_ * auVar37._4_4_;
              auVar43._0_4_ = auVar48._0_4_ * auVar37._0_4_;
              auVar43._8_4_ = auVar48._8_4_ * auVar37._8_4_;
              auVar43._12_4_ = auVar48._12_4_ * auVar37._12_4_;
              auVar43._16_4_ = auVar48._16_4_ * auVar37._16_4_;
              auVar43._20_4_ = auVar48._20_4_ * auVar37._20_4_;
              auVar43._24_4_ = auVar48._24_4_ * auVar37._24_4_;
              auVar43._28_4_ = auVar37._28_4_;
              auVar44._4_4_ = auVar42._4_4_ * auVar32._4_4_;
              auVar44._0_4_ = auVar42._0_4_ * auVar32._0_4_;
              auVar44._8_4_ = auVar42._8_4_ * auVar32._8_4_;
              auVar44._12_4_ = auVar42._12_4_ * auVar32._12_4_;
              auVar44._16_4_ = auVar42._16_4_ * auVar32._16_4_;
              auVar44._20_4_ = auVar42._20_4_ * auVar32._20_4_;
              auVar44._24_4_ = auVar42._24_4_ * auVar32._24_4_;
              auVar44._28_4_ = auVar32._28_4_;
              auVar12._4_4_ = auVar48._4_4_ * auVar33._4_4_;
              auVar12._0_4_ = auVar48._0_4_ * auVar33._0_4_;
              auVar12._8_4_ = auVar48._8_4_ * auVar33._8_4_;
              auVar12._12_4_ = auVar48._12_4_ * auVar33._12_4_;
              auVar12._16_4_ = auVar48._16_4_ * auVar33._16_4_;
              auVar12._20_4_ = auVar48._20_4_ * auVar33._20_4_;
              auVar12._24_4_ = auVar48._24_4_ * auVar33._24_4_;
              auVar12._28_4_ = auVar33._28_4_;
              auVar35 = vpminsd_avx2(auVar40,auVar44);
              auVar36 = vpminsd_avx2(auVar43,auVar12);
              auVar35 = vmaxps_avx(auVar35,auVar36);
              auVar33 = vpminsd_avx2(auVar34,auVar39);
              auVar37 = vpmaxsd_avx2(auVar34,auVar39);
              auVar36 = vpmaxsd_avx2(auVar40,auVar44);
              auVar32 = vpmaxsd_avx2(auVar43,auVar12);
              auVar36 = vminps_avx(auVar36,auVar32);
              auVar33 = vmaxps_avx512vl(auVar88._0_32_,auVar33);
              auVar32 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
              auVar69 = ZEXT3264(auVar32);
              auVar35 = vmaxps_avx(auVar33,auVar35);
              auVar37 = vminps_avx(auVar57._0_32_,auVar37);
              auVar36 = vminps_avx(auVar37,auVar36);
              auVar37._8_4_ = 0x3f7ffffa;
              auVar37._0_8_ = 0x3f7ffffa3f7ffffa;
              auVar37._12_4_ = 0x3f7ffffa;
              auVar37._16_4_ = 0x3f7ffffa;
              auVar37._20_4_ = 0x3f7ffffa;
              auVar37._24_4_ = 0x3f7ffffa;
              auVar37._28_4_ = 0x3f7ffffa;
              auVar35 = vmulps_avx512vl(auVar35,auVar37);
              auVar75 = ZEXT3264(auVar35);
              auVar32._8_4_ = 0x3f800003;
              auVar32._0_8_ = 0x3f8000033f800003;
              auVar32._12_4_ = 0x3f800003;
              auVar32._16_4_ = 0x3f800003;
              auVar32._20_4_ = 0x3f800003;
              auVar32._24_4_ = 0x3f800003;
              auVar32._28_4_ = 0x3f800003;
              auVar36 = vmulps_avx512vl(auVar36,auVar32);
              uVar5 = vcmpps_avx512vl(auVar35,auVar36,2);
              bVar21 = (byte)uVar5;
            }
            else {
              auVar58._4_4_ = fVar59;
              auVar58._0_4_ = fVar59;
              auVar58._8_4_ = fVar59;
              auVar58._12_4_ = fVar59;
              auVar58._16_4_ = fVar59;
              auVar58._20_4_ = fVar59;
              auVar58._24_4_ = fVar59;
              auVar58._28_4_ = fVar59;
              auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar22),auVar58,
                                        *(undefined1 (*) [32])(uVar15 + 0x40 + uVar22));
              auVar32 = vsubps_avx512vl(ZEXT1632(auVar27),auVar35);
              auVar33 = vmulps_avx512vl(auVar82._0_32_,auVar32);
              auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar19),auVar58,
                                        *(undefined1 (*) [32])(uVar15 + 0x40 + uVar19));
              auVar32 = vsubps_avx512vl(ZEXT1632(auVar27),auVar36);
              auVar32 = vmulps_avx512vl(auVar83._0_32_,auVar32);
              auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar20),auVar58,
                                        *(undefined1 (*) [32])(uVar15 + 0x40 + uVar20));
              auVar34 = vsubps_avx512vl(ZEXT1632(auVar27),auVar37);
              auVar34 = vmulps_avx512vl(auVar84._0_32_,auVar34);
              auVar32 = vmaxps_avx(auVar32,auVar34);
              auVar33 = vmaxps_avx512vl(auVar88._0_32_,auVar33);
              auVar32 = vmaxps_avx(auVar33,auVar32);
              auVar75 = ZEXT3264(auVar32);
              auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + (uVar22 ^ 0x20)),
                                        auVar58,*(undefined1 (*) [32])
                                                 (uVar15 + 0x40 + (uVar22 ^ 0x20)));
              auVar35 = vsubps_avx512vl(ZEXT1632(auVar27),auVar35);
              auVar33 = vmulps_avx512vl(auVar85._0_32_,auVar35);
              auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + (uVar19 ^ 0x20)),
                                        auVar58,*(undefined1 (*) [32])
                                                 (uVar15 + 0x40 + (uVar19 ^ 0x20)));
              auVar35 = vsubps_avx512vl(ZEXT1632(auVar27),auVar36);
              auVar35 = vmulps_avx512vl(auVar86._0_32_,auVar35);
              auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + (uVar20 ^ 0x20)),
                                        auVar58,*(undefined1 (*) [32])
                                                 (uVar15 + 0x40 + (uVar20 ^ 0x20)));
              auVar36 = vsubps_avx512vl(ZEXT1632(auVar27),auVar37);
              auVar36 = vmulps_avx512vl(auVar87._0_32_,auVar36);
              auVar35 = vminps_avx(auVar35,auVar36);
              auVar36 = vminps_avx(auVar57._0_32_,auVar33);
              auVar35 = vminps_avx(auVar36,auVar35);
              if (uVar17 == 6) {
                uVar5 = vcmpps_avx512vl(auVar32,auVar35,2);
                uVar7 = vcmpps_avx512vl(auVar58,*(undefined1 (*) [32])(uVar15 + 0x1c0),0xd);
                uVar8 = vcmpps_avx512vl(auVar58,*(undefined1 (*) [32])(uVar15 + 0x1e0),1);
                bVar21 = (byte)uVar5 & (byte)uVar7 & (byte)uVar8;
              }
              else {
                uVar5 = vcmpps_avx512vl(auVar32,auVar35,2);
                bVar21 = (byte)uVar5;
              }
            }
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),(uint)bVar21);
          }
          local_2398 = auVar75._0_32_;
          if ((uVar23 & 8) == 0) {
            if (unaff_R15 == 0) {
              iVar24 = 4;
            }
            else {
              auVar35 = *(undefined1 (*) [32])(uVar23 & 0xfffffffffffffff0);
              auVar36 = ((undefined1 (*) [32])(uVar23 & 0xfffffffffffffff0))[1];
              auVar37 = vpternlogd_avx512vl(auVar69._0_32_,local_2398,auVar74._0_32_,0xf8);
              uVar23 = unaff_R15 & 0xffffffff;
              auVar32 = vpcompressd_avx512vl(auVar37);
              bVar3 = (bool)((byte)uVar23 & 1);
              auVar33._0_4_ = (uint)bVar3 * auVar32._0_4_ | (uint)!bVar3 * auVar37._0_4_;
              bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
              auVar33._4_4_ = (uint)bVar3 * auVar32._4_4_ | (uint)!bVar3 * auVar37._4_4_;
              bVar3 = (bool)((byte)(uVar23 >> 2) & 1);
              auVar33._8_4_ = (uint)bVar3 * auVar32._8_4_ | (uint)!bVar3 * auVar37._8_4_;
              bVar3 = (bool)((byte)(uVar23 >> 3) & 1);
              auVar33._12_4_ = (uint)bVar3 * auVar32._12_4_ | (uint)!bVar3 * auVar37._12_4_;
              bVar3 = (bool)((byte)(uVar23 >> 4) & 1);
              auVar33._16_4_ = (uint)bVar3 * auVar32._16_4_ | (uint)!bVar3 * auVar37._16_4_;
              bVar3 = (bool)((byte)(uVar23 >> 5) & 1);
              auVar33._20_4_ = (uint)bVar3 * auVar32._20_4_ | (uint)!bVar3 * auVar37._20_4_;
              bVar3 = (bool)((byte)(uVar23 >> 6) & 1);
              auVar33._24_4_ = (uint)bVar3 * auVar32._24_4_ | (uint)!bVar3 * auVar37._24_4_;
              bVar3 = (bool)((byte)(uVar23 >> 7) & 1);
              auVar33._28_4_ = (uint)bVar3 * auVar32._28_4_ | (uint)!bVar3 * auVar37._28_4_;
              auVar37 = vpermt2q_avx512vl(auVar35,auVar33,auVar36);
              uVar23 = auVar37._0_8_;
              iVar24 = 0;
              uVar15 = unaff_R15 - 1 & unaff_R15;
              if (uVar15 != 0) {
                auVar37 = vpshufd_avx2(auVar33,0x55);
                vpermt2q_avx512vl(auVar35,auVar37,auVar36);
                auVar32 = vpminsd_avx2(auVar33,auVar37);
                auVar37 = vpmaxsd_avx2(auVar33,auVar37);
                uVar15 = uVar15 - 1 & uVar15;
                if (uVar15 == 0) {
                  auVar32 = vpermi2q_avx512vl(auVar32,auVar35,auVar36);
                  uVar23 = auVar32._0_8_;
                  auVar35 = vpermt2q_avx512vl(auVar35,auVar37,auVar36);
                  *puVar18 = auVar35._0_8_;
                  auVar35 = vpermd_avx2(auVar37,local_2398);
                  *(int *)(puVar18 + 1) = auVar35._0_4_;
                  puVar18 = puVar18 + 2;
                }
                else {
                  auVar41 = vpshufd_avx2(auVar33,0xaa);
                  vpermt2q_avx512vl(auVar35,auVar41,auVar36);
                  auVar34 = vpminsd_avx2(auVar32,auVar41);
                  auVar32 = vpmaxsd_avx2(auVar32,auVar41);
                  auVar41 = vpminsd_avx2(auVar37,auVar32);
                  auVar37 = vpmaxsd_avx2(auVar37,auVar32);
                  uVar15 = uVar15 - 1 & uVar15;
                  if (uVar15 == 0) {
                    auVar32 = vpermi2q_avx512vl(auVar34,auVar35,auVar36);
                    uVar23 = auVar32._0_8_;
                    auVar32 = vpermt2q_avx512vl(auVar35,auVar37,auVar36);
                    *puVar18 = auVar32._0_8_;
                    auVar37 = vpermd_avx2(auVar37,local_2398);
                    *(int *)(puVar18 + 1) = auVar37._0_4_;
                    auVar35 = vpermt2q_avx512vl(auVar35,auVar41,auVar36);
                    puVar18[2] = auVar35._0_8_;
                    auVar35 = vpermd_avx2(auVar41,local_2398);
                    *(int *)(puVar18 + 3) = auVar35._0_4_;
                    puVar18 = puVar18 + 4;
                  }
                  else {
                    auVar32 = vpshufd_avx2(auVar33,0xff);
                    vpermt2q_avx512vl(auVar35,auVar32,auVar36);
                    auVar38 = vpminsd_avx2(auVar34,auVar32);
                    auVar32 = vpmaxsd_avx2(auVar34,auVar32);
                    auVar34 = vpminsd_avx2(auVar41,auVar32);
                    auVar32 = vpmaxsd_avx2(auVar41,auVar32);
                    auVar41 = vpminsd_avx2(auVar37,auVar32);
                    auVar37 = vpmaxsd_avx2(auVar37,auVar32);
                    uVar15 = uVar15 - 1 & uVar15;
                    if (uVar15 == 0) {
                      auVar32 = vpermi2q_avx512vl(auVar38,auVar35,auVar36);
                      uVar23 = auVar32._0_8_;
                      auVar32 = vpermt2q_avx512vl(auVar35,auVar37,auVar36);
                      *puVar18 = auVar32._0_8_;
                      auVar37 = vpermd_avx2(auVar37,local_2398);
                      *(int *)(puVar18 + 1) = auVar37._0_4_;
                      auVar37 = vpermt2q_avx512vl(auVar35,auVar41,auVar36);
                      puVar18[2] = auVar37._0_8_;
                      auVar37 = vpermd_avx2(auVar41,local_2398);
                      *(int *)(puVar18 + 3) = auVar37._0_4_;
                      auVar35 = vpermt2q_avx512vl(auVar35,auVar34,auVar36);
                      puVar18[4] = auVar35._0_8_;
                      auVar35 = vpermd_avx2(auVar34,local_2398);
                      *(int *)(puVar18 + 5) = auVar35._0_4_;
                      puVar18 = puVar18 + 6;
                    }
                    else {
                      auVar48 = valignd_avx512vl(auVar33,auVar33,3);
                      auVar32 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                      auVar33 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar32,auVar38);
                      auVar32 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar33 = vpermt2d_avx512vl(auVar33,auVar32,auVar34);
                      auVar33 = vpermt2d_avx512vl(auVar33,auVar32,auVar41);
                      auVar32 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar37 = vpermt2d_avx512vl(auVar33,auVar32,auVar37);
                      auVar69 = ZEXT3264(auVar37);
                      uVar23 = uVar15;
                      do {
                        auVar32 = auVar69._0_32_;
                        auVar61._8_4_ = 1;
                        auVar61._0_8_ = 0x100000001;
                        auVar61._12_4_ = 1;
                        auVar61._16_4_ = 1;
                        auVar61._20_4_ = 1;
                        auVar61._24_4_ = 1;
                        auVar61._28_4_ = 1;
                        auVar37 = vpermd_avx2(auVar61,auVar48);
                        auVar48 = valignd_avx512vl(auVar48,auVar48,1);
                        vpermt2q_avx512vl(auVar35,auVar48,auVar36);
                        uVar23 = uVar23 - 1 & uVar23;
                        uVar5 = vpcmpd_avx512vl(auVar37,auVar32,5);
                        auVar37 = vpmaxsd_avx2(auVar37,auVar32);
                        bVar21 = (byte)uVar5 << 1;
                        auVar32 = valignd_avx512vl(auVar32,auVar32,7);
                        bVar3 = (bool)((byte)uVar5 & 1);
                        auVar49._4_4_ = (uint)bVar3 * auVar32._4_4_ | (uint)!bVar3 * auVar37._4_4_;
                        auVar49._0_4_ = auVar37._0_4_;
                        bVar3 = (bool)(bVar21 >> 2 & 1);
                        auVar49._8_4_ = (uint)bVar3 * auVar32._8_4_ | (uint)!bVar3 * auVar37._8_4_;
                        bVar3 = (bool)(bVar21 >> 3 & 1);
                        auVar49._12_4_ =
                             (uint)bVar3 * auVar32._12_4_ | (uint)!bVar3 * auVar37._12_4_;
                        bVar3 = (bool)(bVar21 >> 4 & 1);
                        auVar49._16_4_ =
                             (uint)bVar3 * auVar32._16_4_ | (uint)!bVar3 * auVar37._16_4_;
                        bVar3 = (bool)(bVar21 >> 5 & 1);
                        auVar49._20_4_ =
                             (uint)bVar3 * auVar32._20_4_ | (uint)!bVar3 * auVar37._20_4_;
                        bVar3 = (bool)(bVar21 >> 6 & 1);
                        auVar49._24_4_ =
                             (uint)bVar3 * auVar32._24_4_ | (uint)!bVar3 * auVar37._24_4_;
                        auVar49._28_4_ =
                             (uint)(bVar21 >> 7) * auVar32._28_4_ |
                             (uint)!(bool)(bVar21 >> 7) * auVar37._28_4_;
                        auVar69 = ZEXT3264(auVar49);
                      } while (uVar23 != 0);
                      lVar16 = POPCOUNT(uVar15) + 3;
                      do {
                        auVar37 = vpermi2q_avx512vl(auVar49,auVar35,auVar36);
                        *puVar18 = auVar37._0_8_;
                        auVar32 = auVar69._0_32_;
                        auVar37 = vpermd_avx2(auVar32,local_2398);
                        *(int *)(puVar18 + 1) = auVar37._0_4_;
                        auVar49 = valignd_avx512vl(auVar32,auVar32,1);
                        puVar18 = puVar18 + 2;
                        auVar69 = ZEXT3264(auVar49);
                        lVar16 = lVar16 + -1;
                      } while (lVar16 != 0);
                      auVar35 = vpermt2q_avx512vl(auVar35,auVar49,auVar36);
                      uVar23 = auVar35._0_8_;
                    }
                    auVar35 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
                    auVar69 = ZEXT3264(auVar35);
                    auVar74 = ZEXT3264(CONCAT428(0xfffffff8,
                                                 CONCAT424(0xfffffff8,
                                                           CONCAT420(0xfffffff8,
                                                                     CONCAT416(0xfffffff8,
                                                                               CONCAT412(0xfffffff8,
                                                                                         CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
                    iVar24 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar24 = 6;
          }
        } while (iVar24 == 0);
        if (iVar24 == 6) {
          (**(code **)((long)This->leafIntersector +
                      (ulong)*(byte *)(uVar23 & 0xfffffffffffffff0) * 0x40))(local_2578,ray,context)
          ;
          auVar75 = ZEXT3264(local_2398);
          auVar74 = ZEXT3264(CONCAT428(0xfffffff8,
                                       CONCAT424(0xfffffff8,
                                                 CONCAT420(0xfffffff8,
                                                           CONCAT416(0xfffffff8,
                                                                     CONCAT412(0xfffffff8,
                                                                               CONCAT48(0xfffffff8,
                                                                                                                                                                                
                                                  0xfffffff8fffffff8)))))));
          auVar35 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
          auVar69 = ZEXT3264(auVar35);
          auVar88 = ZEXT3264(local_24d8);
          auVar87 = ZEXT3264(local_24b8);
          auVar86 = ZEXT3264(local_2498);
          auVar85 = ZEXT3264(local_2478);
          auVar84 = ZEXT3264(local_2458);
          auVar83 = ZEXT3264(local_2438);
          auVar82 = ZEXT3264(local_2418);
          auVar81 = ZEXT3264(local_23f8);
          auVar80 = ZEXT3264(local_23d8);
          auVar79 = ZEXT3264(local_23b8);
          fVar59 = (ray->super_RayK<1>).tfar;
          auVar57 = ZEXT3264(CONCAT428(fVar59,CONCAT424(fVar59,CONCAT420(fVar59,CONCAT416(fVar59,
                                                  CONCAT412(fVar59,CONCAT48(fVar59,CONCAT44(fVar59,
                                                  fVar59))))))));
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }